

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O0

int __thiscall QSqlTableModelPrivate::insertCount(QSqlTableModelPrivate *this,int maxRow)

{
  long lVar1;
  bool bVar2;
  int *piVar3;
  ModifiedRow *this_00;
  int in_ESI;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  int cnt;
  ConstIterator e;
  ConstIterator i;
  undefined4 in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffcc;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  int local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0;
  QMap<int,_QSqlTableModelPrivate::ModifiedRow>::constBegin
            ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)
             CONCAT17(in_stack_ffffffffffffffcf,
                      CONCAT16(in_stack_ffffffffffffffce,
                               CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))));
  QMap<int,_QSqlTableModelPrivate::ModifiedRow>::constEnd
            ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)
             CONCAT17(in_stack_ffffffffffffffcf,
                      CONCAT16(in_stack_ffffffffffffffce,
                               CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))));
  while( true ) {
    bVar2 = ::operator!=(in_RDI,(const_iterator *)
                                CONCAT17(in_stack_ffffffffffffffcf,
                                         CONCAT16(in_stack_ffffffffffffffce,
                                                  CONCAT24(in_stack_ffffffffffffffcc,
                                                           in_stack_ffffffffffffffc8))));
    in_stack_ffffffffffffffcf = false;
    if ((bVar2) &&
       (in_stack_ffffffffffffffce = true, in_stack_ffffffffffffffcf = in_stack_ffffffffffffffce,
       -1 < in_ESI)) {
      piVar3 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::const_iterator::key
                         ((const_iterator *)0x16b925);
      in_stack_ffffffffffffffce = *piVar3 <= in_ESI;
      in_stack_ffffffffffffffcf = in_stack_ffffffffffffffce;
    }
    if ((bool)in_stack_ffffffffffffffcf == false) break;
    this_00 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::const_iterator::value
                        ((const_iterator *)0x16b94e);
    bVar2 = ModifiedRow::insert(this_00);
    if (bVar2) {
      local_28 = local_28 + 1;
    }
    QMap<int,_QSqlTableModelPrivate::ModifiedRow>::const_iterator::operator++(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

int QSqlTableModelPrivate::insertCount(int maxRow) const
{
    int cnt = 0;
    CacheMap::ConstIterator i = cache.constBegin();
    const CacheMap::ConstIterator e = cache.constEnd();
    for ( ; i != e && (maxRow < 0 || i.key() <= maxRow); ++i)
        if (i.value().insert())
            ++cnt;

    return cnt;
}